

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDD::VariablesQbIncrementPosition(ChNodeFEAxyzDD *this,double step)

{
  double dVar1;
  double dVar2;
  ChVector<double> newspeed_DD;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_78;
  ChVectorRef *local_60;
  undefined8 local_58;
  long local_48;
  ChVectorRef local_40;
  ChVector<double> local_28;
  
  ChNodeFEAxyzD::VariablesQbIncrementPosition(&this->super_ChNodeFEAxyzD,step);
  ChVariables::Get_qb(&local_40,*(ChVariables **)&(this->super_ChNodeFEAxyzD).field_0x138);
  local_78._0_8_ =
       local_40.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  local_78._8_8_ = 3;
  local_58 = 0;
  local_48 = local_40.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  local_60 = &local_40;
  if (2 < (long)local_40.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_28,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_78,(type *)0x0);
    dVar1 = *(double *)&this->field_0x150;
    dVar2 = *(double *)&this->field_0x148;
    *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 =
         step * local_28.m_data[0] + *(double *)&(this->super_ChNodeFEAxyzD).field_0x140;
    *(double *)&this->field_0x148 = step * local_28.m_data[1] + dVar2;
    *(double *)&this->field_0x150 = step * local_28.m_data[2] + dVar1;
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDD::VariablesQbIncrementPosition(double step) {
    ChNodeFEAxyzD::VariablesQbIncrementPosition(step);

    ChVector<> newspeed_DD(variables_DD->Get_qb().segment(0, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    SetDD(GetDD() + newspeed_DD * step);
}